

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

int mj_read_file(uchar **buffer,size_t *len,char *filename)

{
  int iVar1;
  FILE *__stream;
  uchar *__ptr;
  size_t sVar2;
  stat s;
  stat local_b0;
  
  if (filename == (char *)0x0) {
    return 2;
  }
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = fileno(__stream);
    fstat(iVar1,&local_b0);
    *len = local_b0.st_size;
    __ptr = (uchar *)calloc(local_b0.st_size + 1,1);
    *buffer = __ptr;
    if (__ptr == (uchar *)0x0) {
      iVar1 = 1;
    }
    else {
      sVar2 = fread(__ptr,1,local_b0.st_size,__stream);
      fclose(__stream);
      if (sVar2 == *len) {
        return 0;
      }
      free(*buffer);
      iVar1 = 7;
    }
    *len = 0;
  }
  return iVar1;
}

Assistant:

int mj_read_file(unsigned char **buffer, size_t *len, const char *filename) {
    if(filename == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    FILE *      fp;
    struct stat s;

    fp = fopen(filename, "rb");
    if(fp == NULL) {
        return MJ_ERR_FILEIO;
    }

    fstat(fileno(fp), &s);

    *len = (size_t)s.st_size;

    *buffer = (unsigned char *)calloc(*len + 1, sizeof(unsigned char));
    if(*buffer == NULL) {
        *len = 0;

        return MJ_ERR_MEMORY;
    }

    size_t b;
    b = fread(*buffer, 1, *len, fp);

    fclose(fp);

    if(b != *len) {
        free(*buffer);
        *len = 0;

        return MJ_ERR_FILEIO;
    }

    return MJ_OK;
}